

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O0

void raviX_hash_table_destroy(HashTable *ht,_func_void_HashEntry_ptr *delete_function)

{
  HashEntry *local_20;
  HashEntry *entry;
  _func_void_HashEntry_ptr *delete_function_local;
  HashTable *ht_local;
  
  if (ht != (HashTable *)0x0) {
    if (delete_function != (_func_void_HashEntry_ptr *)0x0) {
      for (local_20 = raviX_hash_table_next_entry(ht,(HashEntry *)0x0); local_20 != (HashEntry *)0x0
          ; local_20 = raviX_hash_table_next_entry(ht,local_20)) {
        (*delete_function)(local_20);
      }
    }
    raviX_free(ht->table);
    raviX_free(ht);
  }
  return;
}

Assistant:

void
raviX_hash_table_destroy(HashTable *ht,
		   void (*delete_function)(HashEntry *entry))
{
	if (!ht)
		return;

	if (delete_function) {
		HashEntry *entry;

		hash_table_foreach(ht, entry) {
			delete_function(entry);
		}
	}
	raviX_free(ht->table);
	raviX_free(ht);
}